

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioUtils.c
# Opt level: O1

void Mio_LibraryTransferCellIds(void)

{
  int iVar1;
  Mio_Library_t *pLib;
  SC_Lib *p;
  Mio_Gate_t *pGate;
  char *pcVar2;
  
  pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
  p = (SC_Lib *)Abc_FrameReadLibScl();
  if (p == (SC_Lib *)0x0) {
    pcVar2 = "SC library cannot be found.";
  }
  else {
    if (pLib != (Mio_Library_t *)0x0) {
      for (pGate = Mio_LibraryReadGates(pLib); pGate != (Mio_Gate_t *)0x0;
          pGate = Mio_GateReadNext(pGate)) {
        iVar1 = Mio_GateReadPinNum(pGate);
        if (iVar1 != 0) {
          pcVar2 = Mio_GateReadName(pGate);
          iVar1 = Abc_SclCellFind(p,pcVar2);
          if (iVar1 < 0) {
            pcVar2 = Mio_GateReadName(pGate);
            printf("Cannot find cell ID of gate %s.\n",pcVar2);
          }
          else {
            Mio_GateSetCell(pGate,iVar1);
          }
        }
      }
      return;
    }
    pcVar2 = "Genlib library cannot be found.";
  }
  puts(pcVar2);
  return;
}

Assistant:

void Mio_LibraryTransferCellIds()
{
    Mio_Gate_t * pGate;
    Mio_Library_t * pLib = (Mio_Library_t *)Abc_FrameReadLibGen();
    SC_Lib * pScl = (SC_Lib *)Abc_FrameReadLibScl();
    int CellId;
    if ( pScl == NULL )
    {
        printf( "SC library cannot be found.\n" );
        return;
    }
    if ( pLib == NULL )
    {
        printf( "Genlib library cannot be found.\n" );
        return;
    }
    Mio_LibraryForEachGate( pLib, pGate )
    {
        if ( Mio_GateReadPinNum(pGate) == 0 )
            continue;
        CellId = Abc_SclCellFind( pScl, Mio_GateReadName(pGate) );
        if ( CellId < 0 )
            printf( "Cannot find cell ID of gate %s.\n", Mio_GateReadName(pGate) );
        else
            Mio_GateSetCell( pGate, CellId );
    }
}